

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.cpp
# Opt level: O0

bool __thiscall
NULLCMemory::check_access
          (NULLCMemory *this,NULLCArray buffer,int offset,uint readSizeLog2,int elements)

{
  uint uVar1;
  uint availableElements;
  int elements_local;
  uint readSizeLog2_local;
  int offset_local;
  NULLCArray buffer_local;
  
  uVar1 = buffer.len;
  if (this == (NULLCMemory *)0x0) {
    nullcThrowError("buffer is empty");
    buffer_local.ptr._7_1_ = false;
  }
  else if ((int)uVar1 < 0) {
    nullcThrowError("offset is negative");
    buffer_local.ptr._7_1_ = false;
  }
  else if ((int)readSizeLog2 < 0) {
    nullcThrowError("element count is negative");
    buffer_local.ptr._7_1_ = false;
  }
  else if (uVar1 < (uint)buffer.ptr) {
    if ((uint)buffer.ptr - uVar1 >> ((byte)offset & 0x1f) < readSizeLog2) {
      nullcThrowError("buffer overflow");
      buffer_local.ptr._7_1_ = false;
    }
    else {
      buffer_local.ptr._7_1_ = true;
    }
  }
  else {
    nullcThrowError("buffer overflow");
    buffer_local.ptr._7_1_ = false;
  }
  return buffer_local.ptr._7_1_;
}

Assistant:

bool check_access(NULLCArray buffer, int offset, unsigned readSizeLog2, int elements)
	{
		if(!buffer.ptr)
		{
			nullcThrowError("buffer is empty");
			return false;
		}

		if(offset < 0)
		{
			nullcThrowError("offset is negative");
			return false;
		}

		if(elements < 0)
		{
			nullcThrowError("element count is negative");
			return false;
		}

		if(unsigned(offset) >= buffer.len)
		{
			nullcThrowError("buffer overflow");
			return false;
		}

		unsigned availableElements = ((buffer.len - offset) >> readSizeLog2);

		if(unsigned(elements) > availableElements)
		{
			nullcThrowError("buffer overflow");
			return false;
		}